

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::computeDual(HModel *this)

{
  HVector *this_00;
  int iVar1;
  uint uVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  int i;
  ulong uVar8;
  double *pdVar9;
  int iRow;
  long lVar10;
  ulong uVar11;
  double __x;
  double dVar12;
  double dVar13;
  
  this_00 = &this->buffer;
  HVector::clear(this_00);
  piVar3 = (this->buffer).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->workCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (this->workShift).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->buffer).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar10 = 0; lVar10 < this->numRow; lVar10 = lVar10 + 1) {
    piVar3[lVar10] = (int)lVar10;
    iVar1 = piVar4[lVar10];
    pdVar7[lVar10] = pdVar5[iVar1] + pdVar6[iVar1];
  }
  (this->buffer).count = this->numRow;
  HFactor::btran(&this->factor,this_00,1.0);
  HVector::clear(&this->bufferLong);
  HMatrix::price_by_col(&this->matrix,&this->bufferLong,this_00);
  uVar2 = this->numCol;
  lVar10 = (long)(int)uVar2;
  pdVar5 = (this->workCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (this->workDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->bufferLong).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = 0;
  uVar11 = 0;
  if (0 < (int)uVar2) {
    uVar11 = (ulong)uVar2;
  }
  __x = 0.0;
  for (; uVar11 != uVar8; uVar8 = uVar8 + 1) {
    dVar12 = pdVar5[uVar8] - pdVar7[uVar8];
    dVar13 = dVar12 - pdVar6[uVar8];
    __x = __x + dVar13 * dVar13;
    pdVar6[uVar8] = dVar12;
  }
  iVar1 = this->numTot;
  pdVar5 = (this->workCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (this->workDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar9 = (this->buffer).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (; lVar10 < iVar1; lVar10 = lVar10 + 1) {
    dVar12 = pdVar5[lVar10] - *pdVar9;
    dVar13 = dVar12 - pdVar6[lVar10];
    __x = __x + dVar13 * dVar13;
    pdVar6[lVar10] = dVar12;
    pdVar9 = pdVar9 + 1;
  }
  if (__x < 0.0) {
    sqrt(__x);
  }
  this->mlFg_haveNonbasicDuals = 1;
  return;
}

Assistant:

void HModel::computeDual() {
  //  printf("computeDual: Entry\n");cout<<flush;
  buffer.clear();
  for (int iRow = 0; iRow < numRow; iRow++) {
    buffer.index[iRow] = iRow;
    buffer.array[iRow] = workCost[basicIndex[iRow]]
      + workShift[basicIndex[iRow]];
  }
  buffer.count = numRow;

  //  printf("computeDual: Before BTRAN\n");cout<<flush;
  factor.btran(buffer, 1);
  //  printf("computeDual: After  BTRAN\n");cout<<flush;

#ifdef JAJH_dev
    int n_rp = 0;
    double rp_tl = 0.0;
    int mx_n_rp = 10;
    double norm_dl_du = 0.0;
#endif
  
    bufferLong.clear();
    matrix.price_by_col(bufferLong, buffer);
    for (int i = 0; i < numCol; i++) {
#ifdef JAJH_dev
      double dl_du = abs(workCost[i] - bufferLong.array[i] - workDual[i]);
      if (dl_du > rp_tl && n_rp < mx_n_rp) {
	rp_tl = dl_du*10;
	n_rp += 1;
	//	printf("computeDual():     DlDu   = %11g for i = %d\n", dl_du, i);
      }
      norm_dl_du += dl_du*dl_du;
#endif
      workDual[i] = workCost[i] - bufferLong.array[i];
    }
    for (int i = numCol; i < numTot; i++) {
#ifdef JAJH_dev
      double dl_du = abs(workCost[i] - buffer.array[i - numCol] - workDual[i]);
      if (dl_du > rp_tl && n_rp < mx_n_rp) {
	rp_tl = dl_du*10;
	n_rp += 1;
	//	printf("computeDual():     DlDu_i = %11g for i = %d\n", dl_du, i);
      }
      norm_dl_du += dl_du*dl_du;
#endif
      workDual[i] = workCost[i] - buffer.array[i - numCol];
    }
#ifdef JAJH_dev
    norm_dl_du = sqrt(norm_dl_du);
    //    printf("computeDual():   ||DlDu|| = %11g\n", norm_dl_du);
#endif
    //Now have a nonbasic duals
    mlFg_haveNonbasicDuals = 1;
}